

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CodedOutputStream::Skip(CodedOutputStream *this,int count)

{
  int iVar1;
  bool bVar2;
  
  if (count < 0) {
    return false;
  }
  do {
    iVar1 = this->buffer_size_;
    if (count - iVar1 == 0 || count < iVar1) {
      this->buffer_ = this->buffer_ + count;
      this->buffer_size_ = iVar1 - count;
      return true;
    }
    bVar2 = Refresh(this);
    count = count - iVar1;
  } while (bVar2);
  return false;
}

Assistant:

bool CodedOutputStream::Skip(int count) {
  if (count < 0) return false;

  while (count > buffer_size_) {
    count -= buffer_size_;
    if (!Refresh()) return false;
  }

  Advance(count);
  return true;
}